

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_update_tet_guess(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT *guess)

{
  uint uVar1;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [4];
  int local_30;
  int local_2c;
  REF_INT local_28;
  REF_INT local_24;
  REF_INT local_20;
  REF_INT local_1c;
  
  local_28 = node0;
  local_24 = node1;
  local_20 = node2;
  local_1c = node0;
  uVar1 = ref_cell_with_face(ref_cell,&local_28,&local_2c,&local_30);
  if (uVar1 == 0) {
    if (local_2c == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x338,
             "ref_update_tet_guess","bary update missing first");
      uVar1 = 1;
    }
    else {
      if (local_30 == -1) {
        *guess = -1;
      }
      else if (*guess == local_2c) {
        *guess = local_30;
      }
      else {
        if (*guess != local_30) {
          return 5;
        }
        *guess = local_2c;
      }
      uVar1 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x337,
           "ref_update_tet_guess",(ulong)uVar1,"next");
  }
  return uVar1;
}

Assistant:

REF_FCN static REF_STATUS ref_update_tet_guess(REF_CELL ref_cell, REF_INT node0,
                                               REF_INT node1, REF_INT node2,
                                               REF_INT *guess) {
  REF_INT face_nodes[4], cell0, cell1;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "next");
  if (REF_EMPTY == cell0) THROW("bary update missing first");
  if (REF_EMPTY == cell1) { /* hit boundary */
    *guess = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (*guess == cell0) {
    *guess = cell1;
    return REF_SUCCESS;
  }
  if (*guess == cell1) {
    *guess = cell0;
    return REF_SUCCESS;
  }

  return REF_NOT_FOUND;
}